

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distortion.cc
# Opt level: O1

void __thiscall
gmath::EquidistantDistortion::transform
          (EquidistantDistortion *this,double *x,double *y,double xd,double yd)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  dVar1 = xd * xd + yd * yd;
  if (dVar1 < 0.0) {
    dVar1 = sqrt(dVar1);
  }
  else {
    dVar1 = SQRT(dVar1);
  }
  if (1e-09 < dVar1) {
    dVar2 = atan(dVar1);
    dVar3 = dVar2 * dVar2;
    dVar4 = dVar3 * dVar3;
    dVar1 = ((dVar4 * dVar4 * this->ed[3] +
             dVar3 * dVar4 * this->ed[2] + dVar4 * this->ed[1] + dVar3 * this->ed[0] + 1.0) * dVar2)
            / dVar1;
    xd = xd * dVar1;
    yd = yd * dVar1;
  }
  *x = xd;
  *y = yd;
  return;
}

Assistant:

void EquidistantDistortion::transform(double &x, double &y, double xd, double yd) const
{
  const double radius=std::sqrt(xd*xd+yd*yd);

  if (radius > 1e-9)
  {
    const double theta=std::atan(radius);
    const double theta2=theta*theta;
    const double theta4=theta2*theta2;
    const double theta6=theta4*theta2;
    const double theta8=theta4*theta4;
    const double td=theta*(1+ed[0]*theta2+ed[1]*theta4+ed[2]*theta6+ed[3]*theta8);

    xd*=td/radius;
    yd*=td/radius;
  }

  x=xd;
  y=yd;
}